

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeB,ChVector<double> *Ydir)

{
  ChKblockGeneric *pCVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChMesh *pCVar4;
  pointer psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  char cVar13;
  ChNodeFEAxyzrot *pCVar14;
  ChElementBeamTaperedTimoshenko *pCVar15;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  ulong uVar16;
  ChVector<double> *pCVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeBi;
  ChMatrix33<double> mrot;
  ChVector<double> mZ;
  ChVector<double> mX;
  ChVector<double> mY;
  ChVector<double> local_278;
  shared_ptr<chrono::fea::ChMesh> *local_260;
  ChNodeFEAxyzrot *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_250 [2];
  element_type *local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  undefined8 local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  undefined8 local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  shared_ptr<chrono::fea::ChElementBase> local_210;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_200;
  ChMatrix33<double> local_1f0;
  ChVector<double> local_1a8;
  ChElementBeamTaperedTimoshenko *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_188;
  ulong local_180;
  double local_178;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *local_170;
  ChBuilderBeamTaperedTimoshenko *local_168;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_160;
  ChFrame<double> local_158;
  undefined1 local_c8 [16];
  ChFrame<double> local_b8;
  
  local_260 = mesh;
  local_170 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_168 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  peVar2 = (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_278.m_data[0] =
       *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20 -
       *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  local_278.m_data[1] = *(double *)&peVar2->field_0x28 - *(double *)&peVar3->field_0x28;
  local_278.m_data[2] = *(double *)&peVar2->field_0x30 - *(double *)&peVar3->field_0x30;
  local_158.coord.pos.m_data[1] = 0.0;
  local_158._vptr_ChFrame = (_func_int **)0x0;
  local_158.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 0.0;
  ChVector<double>::DirToDxDyDz
            (&local_278,(ChVector<double> *)&local_158,(ChVector<double> *)&local_b8,&local_1a8,Ydir
            );
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_158._vptr_ChFrame;
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_b8._vptr_ChFrame;
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1a8.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_158.coord.pos.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b8.coord.pos.m_data[0];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1a8.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_158.coord.pos.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b8.coord.pos.m_data[1];
  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1a8.m_data[2];
  local_160 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,nodeA);
  if (0 < N) {
    local_178 = (double)N;
    local_188 = &(nodeB->
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount;
    local_180 = (ulong)(uint)N;
    uVar16 = 1;
    lVar18 = 0x18;
    local_190 = (ChElementBeamTaperedTimoshenko *)&PTR__ChFrame_00b2b308;
    do {
      dVar19 = (double)(int)uVar16 / local_178;
      peVar2 = (local_160->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar14 = (nodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_1a8.m_data[0] = *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
      local_1a8.m_data[0] =
           local_1a8.m_data[0] +
           dVar19 * (*(double *)&(pCVar14->super_ChNodeFEAbase).field_0x20 - local_1a8.m_data[0]);
      local_1a8.m_data[1] =
           *(double *)&peVar2->field_0x28 +
           dVar19 * (*(double *)&pCVar14->field_0x28 - *(double *)&peVar2->field_0x28);
      local_1a8.m_data[2] =
           *(double *)&peVar2->field_0x30 +
           dVar19 * (*(double *)&pCVar14->field_0x30 - *(double *)&peVar2->field_0x30);
      local_278.m_data[0] = 0.0;
      local_278.m_data[1] = 0.0;
      if (uVar16 < local_180) {
        pCVar17 = &local_1a8;
        ChFrame<double>::ChFrame(&local_b8,pCVar17,&local_1f0);
        pCVar14 = (ChNodeFEAxyzrot *)
                  ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar17);
        local_158._vptr_ChFrame = (_func_int **)local_190;
        local_158.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
        local_158.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
        local_158.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
        local_158.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
        local_158.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
        local_158.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
        local_158.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
        local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
             local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        ChNodeFEAxyzrot::ChNodeFEAxyzrot(pCVar14,&local_158);
        local_258 = pCVar14;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<chrono::fea::ChNodeFEAxyzrot*>(a_Stack_250,pCVar14);
        _Var7._M_pi = a_Stack_250[0]._M_pi;
        local_278.m_data[0] = (double)local_258;
        dVar19 = local_278.m_data[1];
        local_258 = (ChNodeFEAxyzrot *)0x0;
        a_Stack_250[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_278.m_data[1] = (double)_Var7._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar19 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar19);
        }
        if (a_Stack_250[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_250[0]._M_pi);
        }
        pCVar4 = (local_260->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_278.m_data[0];
        local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.m_data[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_278.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_278.m_data[1] + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_278.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_278.m_data[1] + 8) + 1;
          }
        }
        ChMesh::AddNode(pCVar4,&local_200);
        if (local_200.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_200.
                     super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        local_278.m_data[0] = (double)pCVar14;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278.m_data + 1),local_188);
      }
      pCVar17 = &local_278;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,(value_type *)pCVar17);
      pCVar15 = (ChElementBeamTaperedTimoshenko *)
                ChElementBeamTaperedTimoshenko::operator_new
                          ((ChElementBeamTaperedTimoshenko *)0x238,(size_t)pCVar17);
      ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko(pCVar15);
      local_158._vptr_ChFrame = (_func_int **)pCVar15;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamTaperedTimoshenko*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.coord,pCVar15);
      pCVar4 = (local_260->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._vptr_ChFrame;
      local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0];
      if ((ChElementBeamTaperedTimoshenko *)local_158.coord.pos.m_data[0] !=
          (ChElementBeamTaperedTimoshenko *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar1 = &(((ChElementBeam *)local_158.coord.pos.m_data[0])->super_ChElementGeneric).Kmatr
          ;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar1 = &(((ChElementBeam *)local_158.coord.pos.m_data[0])->super_ChElementGeneric).Kmatr
          ;
          *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar1->super_ChKblock)._vptr_ChKblock + 1;
        }
      }
      ChMesh::AddElement(pCVar4,&local_210);
      if ((ChElementBeamTaperedTimoshenko *)
          local_210.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (ChElementBeamTaperedTimoshenko *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
      ::push_back(&local_168->beam_elems,(value_type *)&local_158);
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_220 = *(undefined8 *)((long)psVar5 + lVar18 + -0x18);
      local_218 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&psVar5[-1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar18);
      if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_218->_M_use_count = local_218->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_218->_M_use_count = local_218->_M_use_count + 1;
        }
      }
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_230 = *(undefined8 *)((long)psVar5 + lVar18 + -8);
      local_228 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar5->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar18);
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_228->_M_use_count = local_228->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_228->_M_use_count = local_228->_M_use_count + 1;
        }
      }
      (*(((ChElementBeam *)local_158._vptr_ChFrame)->super_ChElementGeneric).super_ChElementBase.
        _vptr_ChElementBase[0x1a])(local_158._vptr_ChFrame,&local_220,&local_230);
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
      }
      if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
      }
      dVar12 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
      dVar11 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [6];
      dVar10 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
      dVar9 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
      ;
      dVar43 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
      dVar8 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      dVar19 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar19) {
        dVar19 = dVar19 + 1.0;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar19;
          auVar21 = vsqrtsd_avx(auVar21,auVar21);
          dVar19 = auVar21._0_8_;
        }
        dVar20 = dVar19 * 0.5;
        dVar19 = 0.5 / dVar19;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (dVar12 - dVar10) * dVar19;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (dVar43 - dVar11) * dVar19;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = (dVar9 - dVar8) * dVar19;
      }
      else {
        cVar13 = local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] < local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4];
        pCVar15 = (ChElementBeamTaperedTimoshenko *)
                  local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0];
        if ((bool)cVar13) {
          pCVar15 = (ChElementBeamTaperedTimoshenko *)
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
        }
        if ((double)pCVar15 <
            local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        {
          cVar13 = '\x02';
        }
        if (cVar13 == '\x02') {
          dVar19 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4]) + 1.0;
          if (dVar19 < 0.0) {
            dVar20 = sqrt(dVar19);
          }
          else {
            auVar23._8_8_ = 0;
            auVar23._0_8_ = dVar19;
            auVar21 = vsqrtsd_avx(auVar23,auVar23);
            dVar20 = auVar21._0_8_;
          }
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar20 * 0.5;
          dVar20 = 0.5 / dVar20;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = (dVar43 + dVar11) * dVar20;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = (dVar10 + dVar12) * dVar20;
          dVar43 = dVar9 - dVar8;
        }
        else if (cVar13 == '\x01') {
          dVar19 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0]) + 1.0;
          if (dVar19 < 0.0) {
            dVar20 = sqrt(dVar19);
          }
          else {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = dVar19;
            auVar21 = vsqrtsd_avx(auVar22,auVar22);
            dVar20 = auVar21._0_8_;
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = dVar20 * 0.5;
          dVar20 = 0.5 / dVar20;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = (dVar10 + dVar12) * dVar20;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = (dVar8 + dVar9) * dVar20;
          dVar43 = dVar43 - dVar11;
        }
        else {
          dVar19 = ((local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] -
                    local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4]) -
                   local_1f0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8]) + 1.0;
          if (dVar19 < 0.0) {
            dVar20 = sqrt(dVar19);
          }
          else {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = dVar19;
            auVar21 = vsqrtsd_avx(auVar24,auVar24);
            dVar20 = auVar21._0_8_;
          }
          auVar44._8_8_ = 0;
          auVar44._0_8_ = dVar20 * 0.5;
          dVar20 = 0.5 / dVar20;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = (dVar8 + dVar9) * dVar20;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = (dVar43 + dVar11) * dVar20;
          dVar43 = dVar12 - dVar10;
        }
        dVar20 = dVar43 * dVar20;
      }
      psVar5 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  *)((long)local_158._vptr_ChFrame + 0xb0))->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      peVar2 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var6 = (psVar5->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      dVar43 = auVar44._0_8_;
      auVar49._0_8_ = -dVar43;
      auVar49._8_8_ = auVar44._8_8_ ^ 0x8000000000000000;
      auVar48._0_8_ = -auVar42._0_8_;
      auVar48._8_8_ = auVar42._8_8_ ^ 0x8000000000000000;
      auVar50._0_8_ = -auVar41._0_8_;
      auVar50._8_8_ = auVar41._8_8_ ^ 0x8000000000000000;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)&peVar2->field_0x48;
      dVar19 = *(double *)&peVar2->field_0x38;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar19;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(double *)&peVar2->field_0x40;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)&peVar2->field_0x50;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar50._0_8_ * dVar19;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar20;
      auVar21 = vfmadd231sd_fma(auVar35,auVar46,auVar33);
      auVar21 = vfmadd231sd_fma(auVar21,auVar42,auVar29);
      auVar21 = vfmadd231sd_fma(auVar21,auVar49,auVar25);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = auVar48._0_8_ * dVar19;
      auVar23 = vfmadd231sd_fma(auVar37,auVar46,auVar25);
      auVar23 = vfmadd231sd_fma(auVar23,auVar50,auVar29);
      auVar23 = vfmadd231sd_fma(auVar23,auVar44,auVar33);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar49._0_8_ * dVar19;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar20;
      auVar24 = vfmadd231sd_fma(auVar39,auVar47,auVar29);
      auVar24 = vfmadd231sd_fma(auVar24,auVar41,auVar25);
      auVar24 = vfmadd231sd_fma(auVar24,auVar48,auVar33);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar43 * *(double *)&peVar2->field_0x40;
      auVar22 = vfmadd231sd_fma(auVar30,auVar47,auVar27);
      auVar22 = vfmadd231sd_fma(auVar22,auVar42,auVar25);
      auVar22 = vfmadd231sd_fma(auVar22,auVar41,auVar33);
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[0] = auVar22._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[1] = auVar24._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[2] = auVar23._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x168))->m_data[3] = auVar21._0_8_;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8 = auVar50;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        auVar50 = local_c8;
      }
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar20;
      psVar5 = (((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  *)((long)local_158._vptr_ChFrame + 0xb0))->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      peVar2 = psVar5[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = psVar5[1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)&peVar2->field_0x48;
      dVar19 = *(double *)&peVar2->field_0x38;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar19;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(double *)&peVar2->field_0x40;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)&peVar2->field_0x50;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auVar50._0_8_ * dVar19;
      auVar21 = vfmadd231sd_fma(auVar36,auVar45,auVar34);
      auVar21 = vfmadd231sd_fma(auVar21,auVar42,auVar31);
      auVar21 = vfmadd231sd_fma(auVar21,auVar49,auVar26);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = auVar48._0_8_ * dVar19;
      auVar23 = vfmadd231sd_fma(auVar38,auVar45,auVar26);
      auVar23 = vfmadd231sd_fma(auVar23,auVar31,auVar50);
      auVar44 = vfmadd231sd_fma(auVar23,auVar44,auVar34);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = auVar49._0_8_ * dVar19;
      auVar23 = vfmadd231sd_fma(auVar40,auVar45,auVar31);
      auVar23 = vfmadd231sd_fma(auVar23,auVar41,auVar26);
      auVar23 = vfmadd231sd_fma(auVar23,auVar34,auVar48);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar43 * *(double *)&peVar2->field_0x40;
      auVar24 = vfmadd231sd_fma(auVar32,auVar45,auVar28);
      auVar42 = vfmadd231sd_fma(auVar24,auVar42,auVar26);
      auVar41 = vfmadd231sd_fma(auVar42,auVar41,auVar34);
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[0] = auVar41._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[1] = auVar23._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[2] = auVar44._0_8_;
      ((ChQuaternion<double> *)((long)local_158._vptr_ChFrame + 0x188))->m_data[3] = auVar21._0_8_;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      local_240 = (local_170->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_238._M_pi =
           (local_170->
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_238._M_pi)->_M_use_count = (local_238._M_pi)->_M_use_count + 1;
        }
      }
      (((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
       ((long)local_158._vptr_ChFrame + 200))->
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_240;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *)
                   ((long)local_158._vptr_ChFrame + 200))->
                  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_238);
      if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
      }
      if ((ChElementBeamTaperedTimoshenko *)local_158.coord.pos.m_data[0] !=
          (ChElementBeamTaperedTimoshenko *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0]);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278.m_data[1]);
      }
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x10;
    } while (N + 1 != uVar16);
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,    // starting point
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeB,    // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(nodeB->Frame().GetPos() - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (nodeB->Frame().GetPos() - nodeA->Frame().GetPos()) * eta;

        std::shared_ptr<ChNodeFEAxyzrot> nodeBi;
        if (i < N) {
            nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
            mesh->AddNode(nodeBi);
        } else
            nodeBi = nodeB;  // last node: use the one passed as parameter.

        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());

        element->SetTaperedSection(sect);
    }
}